

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hyperloglog.cpp
# Opt level: O3

robj * duckdb_hll::hll_merge(robj **hlls,size_t hll_count)

{
  byte count;
  byte bVar1;
  byte bVar2;
  void *pvVar3;
  byte bVar4;
  bool bVar5;
  int iVar6;
  unsigned_long _fb8;
  sds pcVar7;
  robj *prVar8;
  byte bVar9;
  size_t sVar10;
  unsigned_long _byte;
  ulong uVar11;
  long index;
  ulong uVar12;
  uint8_t max [4096];
  byte local_1038 [4104];
  
  switchD_010444a0::default(local_1038,0,0x1000);
  if (hll_count == 0) {
    bVar5 = true;
  }
  else {
    bVar5 = false;
    sVar10 = 0;
    do {
      prVar8 = hlls[sVar10];
      if (prVar8 != (robj *)0x0) {
        if (*(char *)((long)prVar8->ptr + 4) == '\0') {
          bVar5 = true;
        }
        iVar6 = hllMerge(local_1038,prVar8);
        if (iVar6 == -1) {
          return (robj *)0x0;
        }
      }
      sVar10 = sVar10 + 1;
    } while (hll_count != sVar10);
    bVar5 = !bVar5;
  }
  pcVar7 = sdsnewlen((void *)0x0,0x13);
  pcVar7[0x11] = 'O';
  pcVar7[0x12] = -1;
  prVar8 = (robj *)malloc(8);
  prVar8->ptr = pcVar7;
  builtin_strncpy(pcVar7,"HYLL\x01",5);
  if ((!bVar5) && (iVar6 = hllSparseToDense(prVar8), iVar6 == -1)) {
    sdsfree((sds)prVar8->ptr);
    free(prVar8);
    return (robj *)0x0;
  }
  uVar12 = 0;
  index = 0;
  do {
    count = local_1038[index];
    if (count != 0) {
      pvVar3 = prVar8->ptr;
      if (*(char *)((long)pvVar3 + 4) == '\x01') {
        hllSparseSet(prVar8,index,count);
      }
      else if (*(char *)((long)pvVar3 + 4) == '\0') {
        uVar11 = uVar12 >> 3;
        bVar4 = (byte)uVar12 & 6;
        bVar9 = 8 - bVar4;
        bVar1 = *(byte *)((long)pvVar3 + uVar11 + 0x11);
        bVar2 = *(byte *)((long)pvVar3 + uVar11 + 0x12);
        if ((((uint)(bVar1 >> bVar4) | (uint)bVar2 << (bVar9 & 0x1f)) & 0x3f) < (uint)count) {
          *(byte *)((long)pvVar3 + uVar11 + 0x11) = count << bVar4 | ~('?' << bVar4) & bVar1;
          *(byte *)((long)pvVar3 + uVar11 + 0x12) =
               count >> (bVar9 & 0x3f) | (byte)(-0x40 >> (bVar9 & 0x1f)) & bVar2;
        }
      }
    }
    index = index + 1;
    uVar12 = uVar12 + 6;
  } while (index != 0x1000);
  return prVar8;
}

Assistant:

robj *hll_merge(robj **hlls, size_t hll_count) {
    uint8_t max[HLL_REGISTERS];
    struct hllhdr *hdr;
    size_t j;
	 /* Use dense representation as target? */
    int use_dense = 0;

    /* Compute an HLL with M[i] = MAX(M[i]_j).
     * We store the maximum into the max array of registers. We'll write
     * it to the target variable later. */
    memset(max, 0, sizeof(max));
    for (j = 0; j < hll_count; j++) {
        /* Check type and size. */
        robj *o = hlls[j];
        if (o == NULL) continue; /* Assume empty HLL for non existing var. */

        /* If at least one involved HLL is dense, use the dense representation
         * as target ASAP to save time and avoid the conversion step. */
        hdr = (struct hllhdr *) o->ptr;
        if (hdr->encoding == HLL_DENSE) use_dense = 1;

        /* Merge with this HLL with our 'max' HHL by setting max[i]
         * to MAX(max[i],hll[i]). */
        if (hllMerge(max, o) == HLL_C_ERR) {
            return NULL;
        }
    }

    /* Create the destination key's value. */
    robj *result = hll_create();
	if (!result) {
		return NULL;
	}

    /* Convert the destination object to dense representation if at least
     * one of the inputs was dense. */
    if (use_dense && hllSparseToDense(result) == HLL_C_ERR) {
		hll_destroy(result);
        return NULL;
    }

    /* Write the resulting HLL to the destination HLL registers and
     * invalidate the cached value. */
    for (j = 0; j < HLL_REGISTERS; j++) {
        if (max[j] == 0) continue;
        hdr = (struct hllhdr *) result->ptr;
        switch(hdr->encoding) {
        case HLL_DENSE: hllDenseSet(hdr->registers + 1,j,max[j]); break;
        case HLL_SPARSE: hllSparseSet(result,j,max[j]); break;
        }
    }
	return result;
}